

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inSign(Tokenizer *this,char ch)

{
  bool bVar1;
  char ch_local;
  Tokenizer *this_local;
  
  bVar1 = util::is_digit(ch);
  if (bVar1) {
    this->state = st_number;
  }
  else if (ch == '.') {
    this->state = st_decimal;
  }
  else {
    this->state = st_literal;
    inLiteral(this,ch);
  }
  return;
}

Assistant:

void
Tokenizer::inSign(char ch)
{
    if (util::is_digit(ch)) {
        state = st_number;
    } else if (ch == '.') {
        state = st_decimal;
    } else {
        state = st_literal;
        inLiteral(ch);
    }
}